

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O0

promote<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_0UL>_>
* ising::free_energy::square::
  finite_count<unsigned_int,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,0ul>>
            (uint Lx,uint Ly,
            mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
            *Jx,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *Jy,fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                    *beta,
            fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
            *h)

{
  int iVar1;
  invalid_argument *piVar2;
  size_t sVar3;
  allocator_type *paVar4;
  graph *pgVar5;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RCX;
  int in_EDX;
  int in_ESI;
  promote<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_0UL>_>
  *in_RDI;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_R8;
  double in_R9;
  coordinate_t *in_stack_00000008;
  int_t s;
  real_t mag;
  real_t cj;
  real_t ci;
  int_t b;
  real_t energy;
  int_t c;
  value_t Z;
  int_t num_states;
  real_t gs_energy;
  vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  J;
  graph graph;
  unitcell unitcell;
  basis basis;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_ffffffffffffeb18;
  graph *in_stack_ffffffffffffeb20;
  uint in_stack_ffffffffffffeb28;
  uint in_stack_ffffffffffffeb2c;
  allocator_type *in_stack_ffffffffffffeb30;
  size_type in_stack_ffffffffffffeb38;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *this;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *this_00;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *in_stack_ffffffffffffeb48;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *this_01;
  promote<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_0UL>_>
  *ppVar6;
  undefined4 in_stack_ffffffffffffeb90;
  undefined4 in_stack_ffffffffffffeb94;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *in_stack_ffffffffffffeba8;
  int in_stack_ffffffffffffebb4;
  offset_t *in_stack_ffffffffffffebb8;
  size_t in_stack_ffffffffffffebc0;
  size_t in_stack_ffffffffffffebc8;
  unitcell *in_stack_ffffffffffffebd0;
  boundary_t in_stack_ffffffffffffec14;
  span_t *in_stack_ffffffffffffec18;
  unitcell *in_stack_ffffffffffffec20;
  basis *in_stack_ffffffffffffec28;
  graph *in_stack_ffffffffffffec30;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *in_stack_ffffffffffffed60;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
  *in_stack_ffffffffffffed68;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *in_stack_ffffffffffffeda8;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *in_stack_ffffffffffffef70;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *in_stack_ffffffffffffef78;
  uint local_630;
  uint local_428;
  uint local_3e8;
  undefined1 local_139;
  
  if ((in_ESI != 0) && (in_EDX != 0)) {
    this_01 = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
               *)0x2;
    ppVar6 = in_RDI;
    lattice::basis::simple((size_t)in_RDI);
    lattice::unitcell::unitcell
              ((unitcell *)in_stack_ffffffffffffeb20,(size_t)in_stack_ffffffffffffeb18);
    lattice::coordinate((double)in_R8,in_R9);
    lattice::unitcell::add_site
              ((unitcell *)CONCAT44(in_stack_ffffffffffffeb94,in_stack_ffffffffffffeb90),
               in_stack_00000008,(int)((ulong)ppVar6 >> 0x20));
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x112c56);
    lattice::offset((long)in_R8,(long)in_R9);
    lattice::unitcell::add_bond
              (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0,
               in_stack_ffffffffffffebb8,in_stack_ffffffffffffebb4);
    Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x112c9b);
    lattice::offset((long)in_R8,(long)in_R9);
    lattice::unitcell::add_bond
              (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0,
               in_stack_ffffffffffffebb8,in_stack_ffffffffffffebb4);
    Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x112ce4);
    lattice::extent((size_t)in_R8,(size_t)in_R9);
    lattice::graph::graph
              (in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,in_stack_ffffffffffffec20,
               in_stack_ffffffffffffec18,in_stack_ffffffffffffec14);
    Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<long,__1,__1,_0,__1,__1> *)0x112d3f);
    sVar3 = lattice::graph::num_sites((graph *)0x112d4c);
    if (0x1f < sVar3) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar2,"too large system size");
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    this_00 = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
               *)&local_139;
    std::
    allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::allocator((allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                 *)0x112eae);
    std::
    vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    ::vector((vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
              *)this_00,in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
    std::
    allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~allocator((allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                  *)0x112ed4);
    this = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
            *)&stack0xfffffffffffffec8;
    std::
    vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    ::operator[]((vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                  *)this,0);
    mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                 *)in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18);
    std::
    vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    ::operator[]((vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                  *)this,1);
    mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                 *)in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18);
    ::operator+((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                 *)in_RDI,in_RCX);
    ::operator-(in_R8);
    ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                 *)in_RDI,(uint)((ulong)in_RCX >> 0x20));
    sVar3 = lattice::graph::num_sites((graph *)0x112f78);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
    ::fvar<int>(this_00,(int *)this);
    for (local_3e8 = 0; local_3e8 < (uint)(1 << ((byte)sVar3 & 0x1f)); local_3e8 = local_3e8 + 1) {
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::mp_wrapper<int>((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                         *)in_stack_ffffffffffffeb20,(int *)in_stack_ffffffffffffeb18,
                        (type *)0x112fed);
      local_428 = 0;
      while( true ) {
        in_stack_ffffffffffffeb30 = (allocator_type *)(ulong)local_428;
        paVar4 = (allocator_type *)lattice::graph::num_bonds((graph *)0x113013);
        if (paVar4 <= in_stack_ffffffffffffeb30) break;
        mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
        ::mp_wrapper<int>((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_ffffffffffffeb20,(int *)in_stack_ffffffffffffeb18,
                          (type *)0x113048);
        in_stack_ffffffffffffeb2c = local_3e8;
        lattice::graph::source(in_stack_ffffffffffffeb20,(size_t)in_stack_ffffffffffffeb18);
        ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_RDI,(uint)((ulong)in_RCX >> 0x20));
        ::operator-((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_RDI,(int)((ulong)in_RCX >> 0x20));
        mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
        ::mp_wrapper<int>((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_ffffffffffffeb20,(int *)in_stack_ffffffffffffeb18,
                          (type *)0x1130d2);
        in_stack_ffffffffffffeb28 = local_3e8;
        lattice::graph::target(in_stack_ffffffffffffeb20,(size_t)in_stack_ffffffffffffeb18);
        ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_RDI,(uint)((ulong)in_RCX >> 0x20));
        ::operator-((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_RDI,(int)((ulong)in_RCX >> 0x20));
        iVar1 = lattice::graph::bond_type
                          (in_stack_ffffffffffffeb20,(size_t)in_stack_ffffffffffffeb18);
        std::
        vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        ::operator[]((vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                      *)&stack0xfffffffffffffec8,(long)iVar1);
        ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_RDI,in_RCX);
        ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_RDI,in_RCX);
        operator-=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18);
        local_428 = local_428 + 1;
      }
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::mp_wrapper<int>((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                         *)in_stack_ffffffffffffeb20,(int *)in_stack_ffffffffffffeb18,
                        (type *)0x113236);
      local_630 = 0;
      while( true ) {
        in_stack_ffffffffffffeb20 = (graph *)(ulong)local_630;
        pgVar5 = (graph *)lattice::graph::num_sites((graph *)0x11325c);
        if (pgVar5 <= in_stack_ffffffffffffeb20) break;
        mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
        ::mp_wrapper<int>((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_ffffffffffffeb20,(int *)in_stack_ffffffffffffeb18,
                          (type *)0x113291);
        ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_RDI,(uint)((ulong)in_RCX >> 0x20));
        ::operator-((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_RDI,(int)((ulong)in_RCX >> 0x20));
        ::operator+=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18);
        local_630 = local_630 + 1;
      }
      ::operator-((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_RDI,in_RCX);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
      ::operator*((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
                   *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                  (root_type *)in_stack_ffffffffffffeb20);
      boost::math::differentiation::autodiff_v1::detail::operator-
                ((root_type *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                 (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
                  *)in_stack_ffffffffffffeb20);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,0ul>
      ::operator*(in_stack_ffffffffffffed68,in_stack_ffffffffffffed60);
      boost::math::differentiation::autodiff_v1::detail::
      exp<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
                (in_stack_ffffffffffffeba8);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
      ::operator+=(this_01,in_stack_ffffffffffffeb48);
    }
    boost::math::differentiation::autodiff_v1::detail::
    log<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
              (in_stack_ffffffffffffeda8);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
    ::operator-((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                 *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28));
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
    ::operator/(in_stack_ffffffffffffef78,in_stack_ffffffffffffef70);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
    ::operator+(this,(root_type *)in_stack_ffffffffffffeb30);
    mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
    ::mp_wrapper<unsigned_int>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)in_stack_ffffffffffffeb20,(uint *)in_stack_ffffffffffffeb18,(type *)0x113459);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
    ::operator/((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                 *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
                (root_type *)in_stack_ffffffffffffeb20);
    std::
    vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    ::~vector((vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
               *)in_stack_ffffffffffffeb30);
    lattice::graph::~graph(in_stack_ffffffffffffeb20);
    lattice::unitcell::~unitcell((unitcell *)in_stack_ffffffffffffeb20);
    lattice::basis::~basis((basis *)0x1134a8);
    return ppVar6;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar2,"Lx and Ly should be positive");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline boost::math::differentiation::promote<U, W> finite_count(I Lx, I Ly,
                                                                T Jx, T Jy,
                                                                U beta, W h) {
  typedef I int_t;
  typedef T real_t;
  typedef boost::math::differentiation::promote<U, W> value_t;
  if (Lx <= 0 || Ly <= 0)
    throw(std::invalid_argument("Lx and Ly should be positive"));

  auto basis = lattice::basis::simple(2);
  auto unitcell = lattice::unitcell(2);
  unitcell.add_site(lattice::coordinate(0, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(0, 1), 1);
  auto graph = lattice::graph(basis, unitcell, lattice::extent(Lx, Ly));
  if (graph.num_sites() >= 32)
    throw(std::invalid_argument("too large system size"));

  std::vector<real_t> J(2);
  J[0] = Jx;
  J[1] = Jy;
  real_t gs_energy = -(Jx + Jy) * (Lx * Ly);
  int_t num_states = 1 << graph.num_sites();
  value_t Z(0);
  for (int_t c = 0; c < num_states; ++c) {
    real_t energy = 0;
    for (int_t b = 0; b < graph.num_bonds(); ++b) {
      real_t ci = real_t(2) * ((c >> graph.source(b)) & 1) - 1;
      real_t cj = real_t(2) * ((c >> graph.target(b)) & 1) - 1;
      energy -= J[graph.bond_type(b)] * ci * cj;
    }
    real_t mag = 0;
    for (int_t s = 0; s < graph.num_sites(); ++s) {
      mag += real_t(2) * ((c >> s) & 1) - 1;
    }
    Z += exp((gs_energy - energy - h * mag) * beta);
  }
  return (-log(Z) / beta + gs_energy) / (Lx * Ly);
}